

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::jacobiSVD<double>
               (Matrix44<double> *A,Matrix44<double> *U,Vec4<double> *S,Matrix44<double> *V,
               double tol,bool forcePositiveDeterminant)

{
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double local_f0 [4];
  Vec4<double> uCol;
  Matrix44<double> local_b0;
  
  Matrix44<double>::Matrix44(&local_b0,A);
  U->x[0][0] = 1.0;
  U->x[0][1] = 0.0;
  U->x[0][2] = 0.0;
  U->x[0][3] = 0.0;
  U->x[1][0] = 0.0;
  U->x[1][1] = 1.0;
  U->x[1][2] = 0.0;
  U->x[1][3] = 0.0;
  U->x[2][0] = 0.0;
  U->x[2][1] = 0.0;
  U->x[2][2] = 1.0;
  U->x[2][3] = 0.0;
  U->x[3][0] = 0.0;
  U->x[3][1] = 0.0;
  U->x[3][2] = 0.0;
  U->x[3][3] = 1.0;
  V->x[0][0] = 1.0;
  V->x[0][1] = 0.0;
  V->x[0][2] = 0.0;
  V->x[0][3] = 0.0;
  V->x[1][0] = 0.0;
  V->x[1][1] = 1.0;
  V->x[1][2] = 0.0;
  V->x[1][3] = 0.0;
  V->x[2][0] = 0.0;
  V->x[2][1] = 0.0;
  V->x[2][2] = 1.0;
  V->x[2][3] = 0.0;
  V->x[3][0] = 0.0;
  V->x[3][1] = 0.0;
  V->x[3][2] = 0.0;
  V->x[3][3] = 1.0;
  dVar18 = anon_unknown_20::maxOffDiag<double>(&local_b0);
  dVar18 = dVar18 * tol;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    uVar3 = 0;
    while( true ) {
      bVar4 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b0,0,1,U,V,tol);
      bVar5 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b0,0,2,U,V,tol);
      bVar6 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b0,0,3,U,V,tol);
      bVar7 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b0,1,2,U,V,tol);
      bVar8 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b0,1,3,U,V,tol);
      bVar9 = anon_unknown_20::twoSidedJacobiRotation<double>(&local_b0,2,3,U,V,tol);
      if (((((!bVar9) && (!bVar8)) && (!bVar7)) && ((!bVar6 && (!bVar4)))) && (!bVar5)) break;
      dVar19 = anon_unknown_20::maxOffDiag<double>(&local_b0);
      if ((dVar19 <= dVar18) || (bVar4 = 0x12 < uVar3, uVar3 = uVar3 + 1, bVar4)) break;
    }
  }
  pdVar1 = U->x[0] + 1;
  pdVar2 = V->x[0] + 1;
  S->x = local_b0.x[0][0];
  S->y = local_b0.x[1][1];
  S->z = local_b0.x[2][2];
  S->w = local_b0.x[3][3];
  pdVar11 = (double *)U;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    if ((&S->x)[lVar10] < 0.0) {
      (&S->x)[lVar10] = -(&S->x)[lVar10];
      for (lVar12 = 0; lVar12 != 0x80; lVar12 = lVar12 + 0x20) {
        *(ulong *)((long)pdVar11 + lVar12) = *(ulong *)((long)pdVar11 + lVar12) ^ 0x8000000000000000
        ;
      }
    }
    pdVar11 = pdVar11 + 1;
  }
  lVar10 = 1;
  lVar12 = 0;
  pdVar11 = pdVar2;
  pdVar13 = pdVar1;
  do {
    if (lVar12 == 3) {
      if (forcePositiveDeterminant) {
        dVar18 = Matrix44<double>::determinant(U);
        if (dVar18 < 0.0) {
          for (lVar10 = 0; lVar10 != 0x80; lVar10 = lVar10 + 0x20) {
            *(ulong *)((long)U->x[0] + lVar10 + 0x18) =
                 *(ulong *)((long)U->x[0] + lVar10 + 0x18) ^ 0x8000000000000000;
          }
          S->w = -S->w;
        }
        dVar18 = Matrix44<double>::determinant(V);
        if (dVar18 < 0.0) {
          for (lVar10 = 0; lVar10 != 0x80; lVar10 = lVar10 + 0x20) {
            *(ulong *)((long)V->x[0] + lVar10 + 0x18) =
                 *(ulong *)((long)V->x[0] + lVar10 + 0x18) ^ 0x8000000000000000;
          }
          S->w = -S->w;
        }
      }
      return;
    }
    uCol.x = U->x[0][lVar10];
    uCol.y = U->x[1][lVar10];
    uCol.z = U->x[2][lVar10];
    uCol.w = U->x[3][lVar10];
    local_f0[0] = V->x[0][lVar10];
    local_f0[1] = V->x[1][lVar10];
    local_f0[2] = V->x[2][lVar10];
    local_f0[3] = V->x[3][lVar10];
    dVar18 = (&S->x)[lVar10];
    lVar14 = lVar12;
    pdVar15 = pdVar11;
    pdVar16 = pdVar13;
    do {
      lVar17 = lVar14;
      if (ABS(dVar18) <= ABS((&S->x)[lVar14])) break;
      for (lVar17 = 0; lVar17 != 0x80; lVar17 = lVar17 + 0x20) {
        *(undefined8 *)((long)pdVar16 + lVar17) = *(undefined8 *)((long)pdVar16 + lVar17 + -8);
      }
      for (lVar17 = 0; lVar17 != 0x80; lVar17 = lVar17 + 0x20) {
        *(undefined8 *)((long)pdVar15 + lVar17) = *(undefined8 *)((long)pdVar15 + lVar17 + -8);
      }
      (&S->y)[lVar14] = (&S->x)[lVar14];
      pdVar16 = pdVar16 + -1;
      pdVar15 = pdVar15 + -1;
      bVar4 = 0 < lVar14;
      lVar17 = -1;
      lVar14 = lVar14 + -1;
    } while (bVar4);
    lVar14 = (long)(int)lVar17;
    for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 8) {
      *(undefined8 *)((long)pdVar1 + lVar17 * 4 + lVar14 * 8) =
           *(undefined8 *)((long)(local_b0.x + -1) + lVar17);
    }
    for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 8) {
      *(undefined8 *)((long)pdVar2 + lVar17 * 4 + lVar14 * 8) =
           *(undefined8 *)((long)local_f0 + lVar17);
    }
    (&S->y)[lVar14] = dVar18;
    lVar10 = lVar10 + 1;
    lVar12 = lVar12 + 1;
    pdVar13 = pdVar13 + 1;
    pdVar11 = pdVar11 + 1;
  } while( true );
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec4<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}